

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O0

void __thiscall
TC_parser<true>::TC_parser
          (TC_parser<true> *this,char *reading_head,char *endLine,vw *all,example *ae)

{
  long in_RCX;
  char *in_RDX;
  char *in_RSI;
  TC_parser<true> *in_RDI;
  example *in_R8;
  char *local_48;
  char *local_40;
  char *local_38;
  size_t local_30;
  
  v_init<char>();
  (in_RDI->spelling)._begin = local_48;
  (in_RDI->spelling)._end = local_40;
  (in_RDI->spelling).end_array = local_38;
  (in_RDI->spelling).erase_count = local_30;
  if (in_RDX != in_RSI) {
    in_RDI->beginLine = in_RSI;
    in_RDI->reading_head = in_RSI;
    in_RDI->endLine = in_RDX;
    in_RDI->p = *(parser **)(in_RCX + 8);
    in_RDI->redefine_some = (bool)(*(byte *)(in_RCX + 0x5b2) & 1);
    in_RDI->redefine = (uchar (*) [256])(in_RCX + 0x5b3);
    in_RDI->ae = in_R8;
    in_RDI->affix_features = (uint64_t *)(in_RCX + 0x1300);
    in_RDI->spelling_features = (bool *)(in_RCX + 0x1b00);
    in_RDI->namespace_dictionaries =
         (vector<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
          *)(in_RCX + 0x1c18);
    in_RDI->base = (char *)0x0;
    in_RDI->hash_seed = *(uint32_t *)(in_RCX + 0x58);
    listNameSpace(in_RDI);
    if (in_RDI->base != (char *)0x0) {
      free(in_RDI->base);
    }
  }
  return;
}

Assistant:

TC_parser(char* reading_head, char* endLine, vw& all, example* ae)
  {
    spelling = v_init<char>();
    if (endLine != reading_head)
    {
      this->beginLine = reading_head;
      this->reading_head = reading_head;
      this->endLine = endLine;
      this->p = all.p;
      this->redefine_some = all.redefine_some;
      this->redefine = &all.redefine;
      this->ae = ae;
      this->affix_features = all.affix_features;
      this->spelling_features = all.spelling_features;
      this->namespace_dictionaries = all.namespace_dictionaries;
      this->base = nullptr;
      this->hash_seed = all.hash_seed;
      listNameSpace();
      if (base != nullptr)
        free(base);
    }
  }